

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

uint128 CityHashCrc128(char *s,size_t len)

{
  ulong in_RSI;
  uint64 result [4];
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  unsigned_long uStack_38;
  unsigned_long auStack_30 [4];
  uint128 local_10;
  
  if (in_RSI < 0x385) {
    local_10 = CityHash128(s,len);
  }
  else {
    CityHashCrc256(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(uint64 *)0x1ad8c6);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_10,&uStack_38,auStack_30);
  }
  return local_10;
}

Assistant:

uint128 CityHashCrc128(const char *s, size_t len) {
  if (len <= 900) {
    return CityHash128(s, len);
  } else {
    uint64 result[4];
    CityHashCrc256(s, len, result);
    return uint128(result[2], result[3]);
  }
}